

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

int Gla_ManGetVar(Gla_Man_t *p,int iObj,int iFrame)

{
  Gla_Obj_t *pGVar1;
  int local_24;
  int iVar;
  Gla_Obj_t *pGla;
  int iFrame_local;
  int iObj_local;
  Gla_Man_t *p_local;
  
  pGVar1 = Gla_ManObj(p,iObj);
  local_24 = Vec_IntGetEntry(&pGVar1->vFrames,iFrame);
  if (((*(uint *)&pGVar1->field_0x4 >> 4 & 1) == 0) && ((*(uint *)&pGVar1->field_0x4 >> 6 & 1) == 0)
     ) {
    if (local_24 == 0) {
      local_24 = p->nSatVars;
      p->nSatVars = local_24 + 1;
      Vec_IntSetEntry(&pGVar1->vFrames,iFrame,local_24);
      Vec_IntPush(p->vAddedNew,iObj);
      Vec_IntPush(p->vAddedNew,iFrame);
    }
    return local_24;
  }
  __assert_fail("!pGla->fPo && !pGla->fRi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                ,0x51d,"int Gla_ManGetVar(Gla_Man_t *, int, int)");
}

Assistant:

int Gla_ManGetVar( Gla_Man_t * p, int iObj, int iFrame )
{
    Gla_Obj_t * pGla = Gla_ManObj( p, iObj );
    int iVar = Vec_IntGetEntry( &pGla->vFrames, iFrame );
    assert( !pGla->fPo && !pGla->fRi );
    if ( iVar == 0 )
    {
        Vec_IntSetEntry( &pGla->vFrames, iFrame, (iVar = p->nSatVars++) );
        // remember the change
        Vec_IntPush( p->vAddedNew, iObj );
        Vec_IntPush( p->vAddedNew, iFrame );
    }
    return iVar;
}